

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

void __thiscall despot::POMDPXBelief::Update(POMDPXBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  POMDPX *pPVar1;
  State *pSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppSVar5;
  log_ostream *plVar6;
  ostream *poVar7;
  pointer ppSVar8;
  pointer ppSVar9;
  DSPOMDP *model;
  pointer ppSVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  ulong uVar19;
  double dVar20;
  undefined1 auVar21 [16];
  vector<despot::State_*,_std::allocator<despot::State_*>_> updated;
  State *copy;
  OBS_TYPE o;
  double reward;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_98;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_80;
  undefined1 local_68 [16];
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_58;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_68._8_8_ = local_68._0_8_;
  local_68._0_8_ = obs;
  History::Add(&(this->super_ParticleBelief).super_Belief.history_,action,obs);
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (State **)0x0;
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (State **)0x0;
  if (0 < this->max_iter_) {
    ppSVar5 = (this->super_ParticleBelief).particles_.
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar8 = (this->super_ParticleBelief).particles_.
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppSVar9 = (pointer)0x0;
    ppSVar10 = (State **)0x0;
    iVar14 = 0;
    do {
      if (ppSVar8 == ppSVar5) {
        lVar11 = (long)ppSVar10 - (long)ppSVar9;
        lVar12 = 0;
        ppSVar8 = ppSVar5;
      }
      else {
        uVar13 = 0;
        do {
          iVar4 = (*(this->model_->super_MDP)._vptr_MDP[0x1a])(this->model_,ppSVar5[uVar13]);
          pPVar1 = this->model_;
          local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar4);
          dVar16 = Random::NextDouble((Random *)&Random::RANDOM);
          iVar4 = (*(pPVar1->super_MDP)._vptr_MDP[8])
                            (SUB84(dVar16,0),pPVar1,(State *)CONCAT44(extraout_var,iVar4),action,
                             local_38,local_40);
          (*(this->model_->super_MDP)._vptr_MDP[0xc])
                    (this->model_,local_68._0_8_,
                     local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,action);
          if ((char)iVar4 == '\0' && (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != 0.0) {
            *(double *)
             ((long)local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start + 0x18) =
                 (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) *
                 *(double *)
                  ((long)local_80.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_start + 0x18);
            if (local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<despot::State*,std::allocator<despot::State*>>::
              _M_realloc_insert<despot::State*const&>
                        ((vector<despot::State*,std::allocator<despot::State*>> *)&local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(State **)&local_80);
            }
            else {
              *local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
               _M_impl.super__Vector_impl_data._M_finish =
                   (State *)local_80.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
              .super__Vector_impl_data._M_finish =
                   local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            (*(this->model_->super_MDP)._vptr_MDP[0x1b])
                      (this->model_,
                       local_80.
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
                       .super__Vector_impl_data._M_start);
          }
          lVar11 = (long)local_98.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_98.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          ppSVar5 = (this->super_ParticleBelief).particles_.
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppSVar8 = (this->super_ParticleBelief).particles_.
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          lVar12 = (long)ppSVar8 - (long)ppSVar5;
          ppSVar9 = local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppSVar10 = local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        } while ((lVar11 != lVar12) && (uVar13 = uVar13 + 1, uVar13 < (ulong)(lVar12 >> 3)));
      }
      if (lVar11 == lVar12) {
        iVar4 = logging::level();
        if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
          plVar6 = logging::stream(3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&plVar6->super_ostream,"[POMDPXBelief::Update] ",0x17);
          poVar7 = (ostream *)std::ostream::operator<<(plVar6,iVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," iterations for normal simulations",0x22);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        break;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < this->max_iter_);
  }
  ppSVar5 = (this->super_ParticleBelief).particles_.
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar8 = (this->super_ParticleBelief).particles_.
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (((long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
             super__Vector_impl_data._M_start != (long)ppSVar8 - (long)ppSVar5) &&
     (-1 < this->max_iter_)) {
    ppSVar9 = local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    ppSVar10 = local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    iVar14 = 0;
    do {
      if (ppSVar8 == ppSVar5) {
        lVar11 = (long)ppSVar10 - (long)ppSVar9;
        lVar12 = 0;
        ppSVar8 = ppSVar5;
      }
      else {
        uVar13 = 0;
        do {
          iVar4 = (*(this->model_->super_MDP)._vptr_MDP[0x1a])(this->model_,ppSVar5[uVar13]);
          pPVar1 = this->model_;
          local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var_00,iVar4);
          dVar16 = Random::NextDouble((Random *)&Random::RANDOM);
          bVar3 = POMDPX::NoisyStep(pPVar1,(State *)CONCAT44(extraout_var_00,iVar4),dVar16,action);
          (*(this->model_->super_MDP)._vptr_MDP[0xc])
                    (this->model_,local_68._0_8_,
                     local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,action);
          uVar19 = 0x3eb0c6f7a0b5ed8d;
          if (iVar14 != this->max_iter_) {
            uVar19 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
          }
          uVar15 = -(ulong)((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) < 1e-06);
          dVar16 = (double)(~uVar15 & CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) |
                           uVar19 & uVar15);
          if (bVar3 || dVar16 == 0.0) {
            (*(this->model_->super_MDP)._vptr_MDP[0x1b])
                      (this->model_,
                       local_80.
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
                       .super__Vector_impl_data._M_start);
          }
          else {
            *(double *)
             ((long)local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start + 0x18) =
                 dVar16 * *(double *)
                           ((long)local_80.
                                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 0x18);
            if (local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<despot::State*,std::allocator<despot::State*>>::
              _M_realloc_insert<despot::State*const&>
                        ((vector<despot::State*,std::allocator<despot::State*>> *)&local_98,
                         (iterator)
                         local_98.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(State **)&local_80);
            }
            else {
              *local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
               _M_impl.super__Vector_impl_data._M_finish =
                   (State *)local_80.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl
              .super__Vector_impl_data._M_finish =
                   local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          lVar11 = (long)local_98.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_98.
                         super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          ppSVar5 = (this->super_ParticleBelief).particles_.
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppSVar8 = (this->super_ParticleBelief).particles_.
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          lVar12 = (long)ppSVar8 - (long)ppSVar5;
          ppSVar9 = local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          ppSVar10 = local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        } while ((lVar11 != lVar12) && (uVar13 = uVar13 + 1, uVar13 < (ulong)(lVar12 >> 3)));
      }
      if (lVar11 == lVar12) {
        iVar4 = logging::level();
        if ((0 < iVar4) && (iVar4 = logging::level(), 2 < iVar4)) {
          plVar6 = logging::stream(3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&plVar6->super_ostream,"[POMDPXBelief::Update] ",0x17);
          poVar7 = (ostream *)std::ostream::operator<<(plVar6,iVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," iterations for noisy simulations",0x21);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        break;
      }
      bVar3 = iVar14 < this->max_iter_;
      iVar14 = iVar14 + 1;
    } while (bVar3);
  }
  ppSVar8 = (this->super_ParticleBelief).particles_.
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->super_ParticleBelief).particles_.
      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar8) {
    uVar13 = 0;
    do {
      (*(this->model_->super_MDP)._vptr_MDP[0x1b])(this->model_,ppSVar8[uVar13]);
      uVar13 = uVar13 + 1;
      ppSVar8 = (this->super_ParticleBelief).particles_.
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->super_ParticleBelief).particles_.
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar8 >> 3)
            );
  }
  this_00 = &(this->super_ParticleBelief).particles_;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=(this_00,&local_98);
  dVar16 = State::Weight(this_00);
  ppSVar8 = (this->super_ParticleBelief).particles_.
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar11 = (long)(this->super_ParticleBelief).particles_.
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppSVar8;
  if (lVar11 == 0) {
    dVar17 = 0.0;
  }
  else {
    lVar11 = lVar11 >> 3;
    dVar17 = 0.0;
    lVar12 = 0;
    do {
      pSVar2 = ppSVar8[lVar12];
      dVar20 = pSVar2->weight / dVar16;
      pSVar2->weight = dVar20;
      dVar17 = dVar17 + dVar20 * dVar20;
      lVar12 = lVar12 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
  }
  auVar21._8_8_ = (double)(this->super_ParticleBelief).num_particles_;
  auVar21._0_8_ = 0x3ff0000000000000;
  auVar18._8_8_ = 0x4034000000000000;
  auVar18._0_8_ = dVar17;
  local_68 = divpd(auVar21,auVar18);
  if (local_68._0_8_ < local_68._8_8_) {
    iVar14 = logging::level();
    if ((0 < iVar14) && (iVar14 = logging::level(), 2 < iVar14)) {
      plVar6 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,"[POMDPXBelief::Update] Resampling ",0x22);
      poVar7 = (ostream *)
               std::ostream::operator<<(plVar6,(this->super_ParticleBelief).num_particles_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," as effective number of particles = ",0x24);
      poVar7 = std::ostream::_M_insert<double>((double)local_68._0_8_);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    iVar14 = (this->super_ParticleBelief).num_particles_;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_58,this_00);
    model = &this->model_->super_DSPOMDP;
    if (this->model_ == (POMDPX *)0x0) {
      model = (DSPOMDP *)0x0;
    }
    ParticleBelief::Sample(&local_80,iVar14,&local_58,model);
    if (local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    ppSVar8 = (this->super_ParticleBelief).particles_.
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->super_ParticleBelief).particles_.
        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppSVar8) {
      uVar13 = 0;
      do {
        (*(this->model_->super_MDP)._vptr_MDP[0x1b])(this->model_,ppSVar8[uVar13]);
        uVar13 = uVar13 + 1;
        ppSVar8 = (this->super_ParticleBelief).particles_.
                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar13 < (ulong)((long)(this->super_ParticleBelief).particles_.
                                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar8 >>
                               3));
    }
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator=(this_00,&local_80);
    if ((State *)local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                 _M_impl.super__Vector_impl_data._M_start != (State *)0x0) {
      operator_delete(local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Update(ACT_TYPE action, OBS_TYPE obs) {
		history_.Add(action, obs);

		vector<State*> updated;
		double reward;
		OBS_TYPE o;

		// Update particles by looping through the particles for multiple iterations
		for (int i = 0; i < max_iter_; i++) {
			for (int j = 0; j < particles_.size(); j++) {
				State* particle = particles_[j];
				State* copy = model_->Copy(particle);

				bool terminal = model_->Step(*copy, Random::RANDOM.NextDouble(),
					action, reward, o);
				double prob = model_->ObsProb(obs, *copy, action);

				if (!terminal && prob) { // Terminal state is not required to be explicitly represented and may not have any observation
					copy->weight *= prob;
					updated.push_back(copy);
				} else {
					model_->Free(copy);
				}

				if (updated.size() == particles_.size())
					break;
			}
			if (updated.size() == particles_.size()) {
				logi << "[POMDPXBelief::Update] " << i
					<< " iterations for normal simulations" << endl;
				break;
			}
		}

		// Perform at most max_iter_ noisy iterations to generate particles, or keep
		// inconsistent particles after that
		if (updated.size() != particles_.size()) {
			for (int i = 0; i < max_iter_ + 1; i++) {
				for (int j = 0; j < particles_.size(); j++) {
					State* particle = particles_[j];
					State* copy = model_->Copy(particle);

					bool terminal = model_->NoisyStep(*copy,
						Random::RANDOM.NextDouble(), action);
					double prob = model_->ObsProb(obs, *copy, action);

					if (i == max_iter_ && prob < 1E-6) // NOTE: never kill a particle at the last iteration
						prob = 1E-6;

					if (!terminal && prob) {
						copy->weight *= prob;
						updated.push_back(copy);
					} else {
						model_->Free(copy);
					}

					if (updated.size() == particles_.size())
						break;
				}
				if (updated.size() == particles_.size()) {
					logi << "[POMDPXBelief::Update] " << i
						<< " iterations for noisy simulations" << endl;
					break;
				}
			}
		}

		for (int i = 0; i < particles_.size(); i++)
			model_->Free(particles_[i]);

		particles_ = updated;

		double total_weight = State::Weight(particles_);
		double weight_square_sum = 0;
		for (int i = 0; i < particles_.size(); i++) {
			State* particle = particles_[i];
			particle->weight /= total_weight;
			weight_square_sum += particle->weight * particle->weight;
		}

		// Resample if the effective number of particles is "small"
		double num_effective_particles = 1.0 / weight_square_sum;
		if (num_effective_particles < num_particles_ / 20.0) { // NOTE: small particles may be removed...
			logi << "[POMDPXBelief::Update] Resampling " << num_particles_
				<< " as effective number of particles = "
				<< num_effective_particles << endl;
			vector<State*> new_belief = ParticleBelief::Sample(num_particles_,
				particles_, model_);
			for (int i = 0; i < particles_.size(); i++)
				model_->Free(particles_[i]);

			particles_ = new_belief;
		}
	}